

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::EndBinary(Node *this,StreamWriterLE *s,bool has_children)

{
  size_t sVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,has_children) != 0) {
    StreamWriter<false,_false>::PutString(s,(string *)NULL_RECORD_abi_cxx11_);
  }
  StreamWriter<false,_false>::Flush(s);
  iVar3 = (*((s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IOStream[5])();
  this->end_pos = CONCAT44(extraout_var,iVar3);
  sVar1 = this->start_pos;
  StreamWriter<false,_false>::Flush(s);
  peVar2 = (s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_IOStream[4])(peVar2,sVar1,0);
  StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)this->end_pos);
  sVar1 = this->end_pos;
  StreamWriter<false,_false>::Flush(s);
  peVar2 = (s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_IOStream[4])(peVar2,sVar1,0);
  return;
}

Assistant:

void FBX::Node::EndBinary(
    Assimp::StreamWriterLE &s,
    bool has_children
) {
    // if there were children, add a null record
    if (has_children) { s.PutString(Assimp::FBX::NULL_RECORD); }

    // now go back and write initial pos
    this->end_pos = s.Tell();
    s.Seek(start_pos);
    s.PutU4(uint32_t(end_pos));
    s.Seek(end_pos);
}